

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

bool __thiscall
wasm::DAE::refineReturnTypes
          (DAE *this,Function *func,vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          Module *module)

{
  pointer ppCVar1;
  Type results;
  pointer ppCVar2;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  Signature SVar3;
  
  results.id = (uintptr_t)LUB::getResultsLUB(func,module);
  if ((results.id != 1) &&
     (SVar3 = HeapType::getSignature(&func->type), results.id != SVar3.results.id.id)) {
    Function::setResults(func,results);
    ppCVar1 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar2 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppCVar2 != ppCVar1; ppCVar2 = ppCVar2 + 1) {
      if (((*ppCVar2)->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id
          != 1) {
        ((*ppCVar2)->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
             results.id;
      }
    }
    return true;
  }
  return false;
}

Assistant:

bool refineReturnTypes(Function* func,
                         const std::vector<Call*>& calls,
                         Module* module) {
    auto lub = LUB::getResultsLUB(func, *module);
    if (!lub.noted()) {
      return false;
    }
    auto newType = lub.getLUB();
    if (newType != func->getResults()) {
      func->setResults(newType);
      for (auto* call : calls) {
        if (call->type != Type::unreachable) {
          call->type = newType;
        }
      }
      return true;
    }
    return false;
  }